

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<float,double>
                 (size_t nrows,int *x,int ncat,double *buffer_prob,MissingAction missing_action,
                 CategSplit cat_split_type,Xoshiro256PP *rnd_generator,float *w)

{
  size_t sVar1;
  long lVar2;
  allocator_type local_59;
  double local_58;
  vector<double,_std::allocator<double>_> buffer_cnt;
  value_type_conflict local_38;
  
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&buffer_cnt,(long)(ncat + 1),&local_38,&local_59);
  if (nrows != 0) {
    sVar1 = 0;
    do {
      lVar2 = (long)x[sVar1];
      if ((long)x[sVar1] < 0) {
        lVar2 = (long)ncat;
      }
      buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar2] =
           (double)w[sVar1] +
           buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2];
      sVar1 = sVar1 + 1;
    } while (nrows != sVar1);
  }
  local_58 = calc_kurtosis_weighted_internal<float*restrict,double>
                       (&buffer_cnt,x,ncat,buffer_prob,missing_action,cat_split_type,rnd_generator,
                        &w);
  if (buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buffer_cnt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_58;
}

Assistant:

double calc_kurtosis_weighted(size_t nrows, int x[], int ncat, double *restrict buffer_prob,
                              MissingAction missing_action, CategSplit cat_split_type,
                              RNG_engine &rnd_generator, real_t *restrict w)
{
    std::vector<ldouble_safe> buffer_cnt(ncat+1, 0.);
    ldouble_safe w_this;

    for (size_t row = 0; row < nrows; row++)
    {
        w_this = w[row];
        if (likely(x[row] >= 0))
            buffer_cnt[x[row]] += w_this;
        else
            buffer_cnt[ncat] += w_this;
    }
    
    return calc_kurtosis_weighted_internal<real_t *restrict, ldouble_safe>(
                                           buffer_cnt, x, ncat,
                                           buffer_prob, missing_action, cat_split_type,
                                           rnd_generator, w);
}